

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O1

int __thiscall sjtu::OrderManager::init(OrderManager *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar2;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RDX;
  string local_a8;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  undefined8 local_28;
  long lVar4;
  
  if ((int)ctx == 0) {
    pFVar2 = (FileManager<std::pair<sjtu::orderType,_long>_> *)operator_new(0x228);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"OrderFile.dat","");
    FileManager<std::pair<sjtu::orderType,_long>_>::FileManager(pFVar2,&local_88,0x40);
    this->OrderFile = pFVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = (BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              *)operator_new(0x18);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"PendingBpTree.dat","");
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::BplusTree(pBVar3,&local_a8,0x100);
    this->PendingBpTree = pBVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pFVar2 = this->OrderFile;
    if ((pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).is_newfile != true) {
      local_28 = 0;
      iVar1 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[2])();
      iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0xa0);
      this->pending_id = iVar1;
      return iVar1;
    }
  }
  else {
    pFVar2 = this->OrderFile;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"OrderFile.dat","");
    (**(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)._vptr_FileManager_Base)
              (pFVar2,(string *)local_48,0x40,1);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    pBVar3 = this->PendingBpTree;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PendingBpTree.dat","");
    BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
    ::init(pBVar3,(EVP_PKEY_CTX *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pFVar2 = this->OrderFile;
  }
  iVar1 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[1])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  *(undefined8 *)(lVar4 + 0xb0) = extraout_RDX;
  *(undefined4 *)(lVar4 + 0xa0) = 0;
  iVar1 = (*(this->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
            _vptr_FileManager_Base[3])(this->OrderFile,lVar4 + 0xb0);
  return iVar1;
}

Assistant:

void init(bool obj = false) {
            if (obj == false) {
                OrderFile = new FileManager<std::pair<orderType, locType>>("OrderFile.dat" , OrderFile_cache_size);
                PendingBpTree = new BplusTree<std::pair<StringHasher::hashType, int>, locType>("PendingBpTree.dat" , PendingBpTree_cache_size);
                if (OrderFile->is_newfile) {
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
                } else {
                    auto tmp = OrderFile->read(0);
                    pending_id = tmp->first.num;
                }
            } else {
                OrderFile->init("OrderFile.dat", OrderFile_cache_size , true);
                PendingBpTree->init("PendingBpTree.dat", PendingBpTree_cache_size , true);
                    auto ret = OrderFile -> newspace();
                    ret.first -> first.offset = ret.second;
                    ret.first -> first.num = 0;
                    OrderFile->save(ret.first -> first.offset);
            }
        }